

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemandDisk.cpp
# Opt level: O2

ssize_t __thiscall DemandDisk::read(DemandDisk *this,int __fd,void *__buf,size_t __nbytes)

{
  mutex *__mutex;
  _WordT *p_Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Track *this_00;
  Track *this_01;
  mapped_type *this_02;
  ssize_t sVar8;
  ulong __nbytes_00;
  undefined4 in_register_00000034;
  CylHead *this_03;
  TrackData trackdata;
  TrackData rescan_trackdata;
  
  this_03 = (CylHead *)CONCAT44(in_register_00000034,__fd);
  if ((int)__buf == 0) {
    iVar3 = CylHead::operator_cast_to_int(this_03);
    __nbytes_00 = (this->m_loaded).super__Base_bitset<4UL>._M_w[(ulong)(long)iVar3 >> 6];
    if ((__nbytes_00 >> ((long)iVar3 & 0x3fU) & 1) != 0) goto LAB_0015ec6d;
  }
  (*(this->super_Disk)._vptr_Disk[7])(&trackdata,this,this_03,1);
  this_00 = TrackData::track(&trackdata);
  iVar4 = (*(this->super_Disk)._vptr_Disk[6])(this);
  iVar3 = 0;
  if ((char)iVar4 == '\0') {
    iVar3 = opt.retries;
  }
  iVar4 = opt.rescans;
  for (; (0 < iVar4 || (0 < iVar3)); iVar3 = iVar3 - iVar5) {
    if (iVar4 < 1) {
      bVar2 = Track::has_good_data(this_00);
      if (bVar2) break;
    }
    (*(this->super_Disk)._vptr_Disk[7])(&rescan_trackdata,this,this_03,0);
    this_01 = TrackData::track(&rescan_trackdata);
    iVar5 = Track::size(this_01);
    iVar6 = Track::size(this_00);
    if (iVar6 < iVar5) {
      std::swap<TrackData>(&trackdata,&rescan_trackdata);
    }
    bVar2 = TrackData::has_flux(&trackdata);
    iVar5 = (uint)bVar2 * 4 + 1;
    iVar4 = iVar4 - iVar5;
    TrackData::~TrackData(&rescan_trackdata);
  }
  __mutex = &(this->super_Disk).m_trackdata_mutex;
  std::mutex::lock(__mutex);
  this_02 = std::
            map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
            ::operator[](&(this->super_Disk).m_trackdata,this_03);
  TrackData::operator=(this_02,&trackdata);
  uVar7 = CylHead::operator_cast_to_int(this_03);
  __nbytes_00 = (ulong)uVar7;
  p_Var1 = (this->m_loaded).super__Base_bitset<4UL>._M_w + ((ulong)(long)(int)uVar7 >> 6);
  *p_Var1 = *p_Var1 | 1L << ((byte)uVar7 & 0x3f);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  TrackData::~TrackData(&trackdata);
LAB_0015ec6d:
  sVar8 = Disk::read(&this->super_Disk,__fd,(void *)0x0,__nbytes_00);
  return sVar8;
}

Assistant:

const TrackData& DemandDisk::read(const CylHead& cylhead, bool uncached)
{
    if (uncached || !m_loaded[cylhead])
    {
        // Quick first read, plus sector-based conversion
        auto trackdata = load(cylhead, true);
        auto& track = trackdata.track();

        // If the disk supports sector-level retries we won't duplicate them.
        auto retries = supports_retries() ? 0 : opt.retries;
        auto rescans = opt.rescans;

        // Consider rescans and error retries.
        while (rescans > 0 || retries > 0)
        {
            // If no more rescans are required, stop when there's nothing to fix.
            if (rescans <= 0 && track.has_good_data())
                break;

            auto rescan_trackdata = load(cylhead);
            auto& rescan_track = rescan_trackdata.track();

            // If the rescan found more sectors, use the new track data.
            if (rescan_track.size() > track.size())
                std::swap(trackdata, rescan_trackdata);

            // Flux reads include 5 revolutions, others just 1
            auto revs = trackdata.has_flux() ? REMAIN_READ_REVS : 1;
            rescans -= revs;
            retries -= revs;
        }

        std::lock_guard<std::mutex> lock(m_trackdata_mutex);
        m_trackdata[cylhead] = std::move(trackdata);
        m_loaded[cylhead] = true;
    }

    return Disk::read(cylhead);
}